

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ArgumentListSyntax::ArgumentListSyntax
          (ArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *parameters,Token closeParen)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ArgumentSyntax *pAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::ArgumentSyntax_*> local_30;
  
  uVar6 = closeParen._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).kind = ArgumentList;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(parameters->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (parameters->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.kind =
       (parameters->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->parameters).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (parameters->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->parameters).super_SyntaxListBase.childCount = (parameters->super_SyntaxListBase).childCount
  ;
  (this->parameters).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e8488;
  sVar1 = (parameters->elements)._M_extent._M_extent_value;
  (this->parameters).elements._M_ptr = (parameters->elements)._M_ptr;
  (this->parameters).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->parameters).elements._M_extent._M_extent_value;
  local_30.list = &this->parameters;
  for (; (local_30.list != &this->parameters || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pAVar4 = SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::
             iterator_base<slang::syntax::ArgumentSyntax_*>::dereference(&local_30);
    (pAVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

ArgumentListSyntax(Token openParen, const SeparatedSyntaxList<ArgumentSyntax>& parameters, Token closeParen) :
        SyntaxNode(SyntaxKind::ArgumentList), openParen(openParen), parameters(parameters), closeParen(closeParen) {
        this->parameters.parent = this;
        for (auto child : this->parameters)
            child->parent = this;
    }